

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.cc
# Opt level: O1

int features::Matching::count_consistent_matches(Result *matches)

{
  pointer piVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  piVar1 = (matches->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(matches->matches_1_2).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    iVar2 = 0;
    do {
      lVar5 = (long)piVar1[uVar4];
      if (lVar5 != -1) {
        iVar2 = iVar2 + (uint)(uVar4 == (uint)(matches->matches_2_1).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar5]);
      }
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int
Matching::count_consistent_matches (Matching::Result const& matches)
{
    int counter = 0;
    for (int i = 0; i < static_cast<int>(matches.matches_1_2.size()); ++i)
        if (matches.matches_1_2[i] != -1
            && matches.matches_2_1[matches.matches_1_2[i]] == i)
            counter++;
    return counter;
}